

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Bmci(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_40;
  uint local_3c;
  int fVerbose;
  int fSim;
  int nTimeOut;
  int nWords;
  int nFrames;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nTimeOut = 1000;
  fSim = 1000;
  fVerbose = 0;
  local_3c = 0;
  local_40 = 0;
  Extra_UtilGetoptReset();
LAB_002c035d:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"FWTsvh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Bmci(): There is no AIG.\n");
        return 0;
      }
      iVar1 = Gia_ManRegNum(pAbc->pGia);
      if (iVar1 == 0) {
        Abc_Print(-1,"Abc_CommandAbc9Bmci(): AIG is combinational.\n");
        return 0;
      }
      if (pAbc->pGia->vInitClasses == (Vec_Int_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Bmci(): Init array is not given.\n");
        return 0;
      }
      Gia_ManBmciTest(pAbc->pGia,pAbc->pGia->vInitClasses,nTimeOut,fSim,fVerbose,local_3c,local_40);
      return 0;
    }
    switch(iVar1) {
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_002c05cd;
      }
      nTimeOut = atoi(argv[globalUtilOptind]);
      iVar1 = nTimeOut;
      break;
    default:
      goto LAB_002c05cd;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002c05cd;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      iVar1 = fVerbose;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_002c05cd;
      }
      fSim = atoi(argv[globalUtilOptind]);
      iVar1 = fSim;
      break;
    case 0x68:
      goto LAB_002c05cd;
    case 0x73:
      local_3c = local_3c ^ 1;
      goto LAB_002c035d;
    case 0x76:
      local_40 = local_40 ^ 1;
      goto LAB_002c035d;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_002c05cd:
      Abc_Print(-2,"usage: &bmci [-FWT num] [-svh]\n");
      Abc_Print(-2,"\t         experimental procedure\n");
      Abc_Print(-2,"\t-F num : the number of timeframes [default = %d]\n",(ulong)(uint)nTimeOut);
      Abc_Print(-2,"\t-W num : the number of machine words [default = %d]\n",(ulong)(uint)fSim);
      Abc_Print(-2,"\t-T num : approximate global runtime limit in seconds [default = %d]\n",
                (ulong)(uint)fVerbose);
      pcVar2 = "no";
      if (local_3c != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggles using ternary simulation [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (local_40 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Bmci( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Gia_ManBmciTest( Gia_Man_t * p, Vec_Int_t * vInit, int nFrames, int nWords, int nTimeOut, int fSim, int fVerbose );
    int c, nFrames = 1000, nWords = 1000, nTimeOut = 0, fSim = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FWTsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeOut < 0 )
                goto usage;
            break;
        case 's':
            fSim ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmci(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmci(): AIG is combinational.\n" );
        return 0;
    }
    if ( pAbc->pGia->vInitClasses == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmci(): Init array is not given.\n" );
        return 0;
    }
    Gia_ManBmciTest( pAbc->pGia, pAbc->pGia->vInitClasses, nFrames, nWords, nTimeOut, fSim, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &bmci [-FWT num] [-svh]\n" );
    Abc_Print( -2, "\t         experimental procedure\n" );
    Abc_Print( -2, "\t-F num : the number of timeframes [default = %d]\n",                    nFrames );
    Abc_Print( -2, "\t-W num : the number of machine words [default = %d]\n",                 nWords );
    Abc_Print( -2, "\t-T num : approximate global runtime limit in seconds [default = %d]\n", nTimeOut );
    Abc_Print( -2, "\t-s     : toggles using ternary simulation [default = %s]\n",            fSim?     "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",        fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}